

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usprep.cpp
# Opt level: O2

UBool isSPrepAcceptable(void *param_1,char *param_2,char *param_3,UDataInfo *pInfo)

{
  if ((((((0x13 < pInfo->size) && (pInfo->isBigEndian == '\0')) && (pInfo->charsetFamily == '\0'))
       && ((pInfo->dataFormat[0] == 'S' && (pInfo->dataFormat[1] == 'P')))) &&
      ((pInfo->dataFormat[2] == 'R' &&
       ((pInfo->dataFormat[3] == 'P' && (pInfo->formatVersion[0] == '\x03')))))) &&
     ((pInfo->formatVersion[2] == '\x05' && (pInfo->formatVersion[3] == '\x02')))) {
    dataVersion = *&pInfo->dataVersion;
    return '\x01';
  }
  return '\0';
}

Assistant:

static UBool U_CALLCONV
isSPrepAcceptable(void * /* context */,
             const char * /* type */, 
             const char * /* name */,
             const UDataInfo *pInfo) {
    if(
        pInfo->size>=20 &&
        pInfo->isBigEndian==U_IS_BIG_ENDIAN &&
        pInfo->charsetFamily==U_CHARSET_FAMILY &&
        pInfo->dataFormat[0]==0x53 &&   /* dataFormat="SPRP" */
        pInfo->dataFormat[1]==0x50 &&
        pInfo->dataFormat[2]==0x52 &&
        pInfo->dataFormat[3]==0x50 &&
        pInfo->formatVersion[0]==3 &&
        pInfo->formatVersion[2]==UTRIE_SHIFT &&
        pInfo->formatVersion[3]==UTRIE_INDEX_SHIFT
    ) {
        //uprv_memcpy(formatVersion, pInfo->formatVersion, 4);
        uprv_memcpy(dataVersion, pInfo->dataVersion, 4);
        return TRUE;
    } else {
        return FALSE;
    }
}